

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_macro5.c
# Opt level: O0

int dwarf_get_macro_context_by_offset
              (Dwarf_Die cu_die,Dwarf_Unsigned offset,Dwarf_Unsigned *version_out,
              Dwarf_Macro_Context *macro_context,Dwarf_Unsigned *macro_ops_count_out,
              Dwarf_Unsigned *macro_ops_data_length,Dwarf_Error *error)

{
  int iVar1;
  Dwarf_Unsigned local_48;
  Dwarf_Unsigned macro_unit_offset_out;
  Dwarf_Bool offset_specified;
  int res;
  Dwarf_Unsigned *macro_ops_data_length_local;
  Dwarf_Unsigned *macro_ops_count_out_local;
  Dwarf_Macro_Context *macro_context_local;
  Dwarf_Unsigned *version_out_local;
  Dwarf_Unsigned offset_local;
  Dwarf_Die cu_die_local;
  
  macro_unit_offset_out._4_4_ = 0;
  macro_unit_offset_out._0_4_ = 1;
  local_48 = 0;
  _offset_specified = macro_ops_data_length;
  macro_ops_data_length_local = macro_ops_count_out;
  macro_ops_count_out_local = (Dwarf_Unsigned *)macro_context;
  macro_context_local = (Dwarf_Macro_Context *)version_out;
  version_out_local = (Dwarf_Unsigned *)offset;
  offset_local = (Dwarf_Unsigned)cu_die;
  iVar1 = _dwarf_internal_macro_context
                    (cu_die,1,offset,version_out,macro_context,&local_48,macro_ops_count_out,
                     macro_ops_data_length,error);
  return iVar1;
}

Assistant:

int
dwarf_get_macro_context_by_offset(Dwarf_Die cu_die,
    Dwarf_Unsigned offset,
    Dwarf_Unsigned      * version_out,
    Dwarf_Macro_Context * macro_context,
    Dwarf_Unsigned      * macro_ops_count_out,
    Dwarf_Unsigned      * macro_ops_data_length,
    Dwarf_Error * error)
{
    int res = 0;
    Dwarf_Bool offset_specified = TRUE;
    Dwarf_Unsigned macro_unit_offset_out = 0;

    res = _dwarf_internal_macro_context(cu_die,
        offset_specified,
        offset,
        version_out,
        macro_context,
        &macro_unit_offset_out,
        macro_ops_count_out,
        macro_ops_data_length,
        error);
    return res;
}